

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBufferTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureBufferBindingQueryCase::iterate
          (TextureBufferBindingQueryCase *this)

{
  TestLog *pTVar1;
  bool bVar2;
  ContextType ctxType;
  int iVar3;
  GLenum GVar4;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  GLuint buffer;
  allocator<char> local_139;
  string local_138;
  string local_118;
  CallLogWrapper gl;
  ScopedLogSection section_1;
  ScopedLogSection section;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  ResultCollector result;
  code *local_28;
  GLenum local_20;
  
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (!bVar2) {
    bVar2 = glu::ContextInfo::isExtensionSupported
                      (((this->super_TestCase).m_context)->m_contextInfo,"GL_EXT_texture_buffer");
    if (!bVar2) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_00,"GL_EXT_texture_buffer is not supported",
                 "supportsES32 || m_context.getContextInfo().isExtensionSupported(\"GL_EXT_texture_buffer\")"
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureBufferTests.cpp"
                 ,0xdf);
      __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&gl,(Functions *)CONCAT44(extraout_var,iVar3),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138," // ERROR: ",(allocator<char> *)&local_118);
  tcu::ResultCollector::ResultCollector(&result,pTVar1,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  gl.m_enableLog = true;
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"initial",(allocator<char> *)&local_b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"Initial value",(allocator<char> *)&local_98);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar1,&local_138,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  gls::StateQueryUtil::verifyStateInteger(&result,&gl,0x8c2a,0,this->m_type);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"bind",(allocator<char> *)&section);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"After bind",(allocator<char> *)&local_b8);
  tcu::ScopedLogSection::ScopedLogSection(&section_1,pTVar1,&local_138,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  glu::CallLogWrapper::glGenBuffers(&gl,1,&buffer);
  glu::CallLogWrapper::glBindBuffer(&gl,0x8c2a,buffer);
  GVar4 = glu::CallLogWrapper::glGetError(&gl);
  if (GVar4 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"Got Error ",&local_139);
    local_28 = glu::getErrorName;
    local_20 = GVar4;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_98,&local_28);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   &local_b8,&local_98);
    std::operator+(&local_118,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   ": ");
    std::operator+(&local_138,&local_118,"bind buffer");
    tcu::ResultCollector::fail(&result,&local_138);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&section);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  gls::StateQueryUtil::verifyStateInteger(&result,&gl,0x8c2a,buffer,this->m_type);
  glu::CallLogWrapper::glDeleteBuffers(&gl,1,&buffer);
  tcu::ScopedLogSection::~ScopedLogSection(&section_1);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"bind",(allocator<char> *)&local_b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"After delete",(allocator<char> *)&local_98);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar1,&local_138,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  gls::StateQueryUtil::verifyStateInteger(&result,&gl,0x8c2a,0,this->m_type);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  tcu::ResultCollector::setTestContextResult
            (&result,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::ResultCollector::~ResultCollector(&result);
  glu::CallLogWrapper::~CallLogWrapper(&gl);
  return STOP;
}

Assistant:

TextureBufferBindingQueryCase::IterateResult TextureBufferBindingQueryCase::iterate (void)
{
	const bool supportsES32 = glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));
	TCU_CHECK_AND_THROW(NotSupportedError, supportsES32 || m_context.getContextInfo().isExtensionSupported("GL_EXT_texture_buffer"), "GL_EXT_texture_buffer is not supported");

	glu::CallLogWrapper		gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");

	gl.enableLogging(true);

	// initial
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "initial", "Initial value");

		verifyStateInteger(result, gl, GL_TEXTURE_BUFFER_BINDING, 0, m_type);
	}

	// bind
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "bind", "After bind");

		glw::GLuint buffer;

		gl.glGenBuffers(1, &buffer);
		gl.glBindBuffer(GL_TEXTURE_BUFFER, buffer);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "bind buffer");

		verifyStateInteger(result, gl, GL_TEXTURE_BUFFER_BINDING, buffer, m_type);

		gl.glDeleteBuffers(1, &buffer);
	}

	// after delete
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "bind", "After delete");

		verifyStateInteger(result, gl, GL_TEXTURE_BUFFER_BINDING, 0, m_type);
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}